

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

string * __thiscall Color::colorize(string *__return_storage_ptr__,Color *this,string *input)

{
  string *input_local;
  Color *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  _colorize(this,__return_storage_ptr__,input);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::colorize (const std::string& input) const
{
  std::string result;
  _colorize (result, input);
  return result;
}